

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

Own<capnp::ClientHook> capnp::anon_unknown_0::newNullCap(void)

{
  ClientHook *extraout_RDX;
  Own<capnp::ClientHook> *in_RDI;
  Own<capnp::ClientHook> OVar1;
  uint *local_30;
  bool local_21;
  Own<capnp::(anonymous_namespace)::BrokenClient> local_20;
  
  local_21 = true;
  local_30 = &ClientHook::NULL_CAPABILITY_BRAND;
  kj::
  refcounted<capnp::(anonymous_namespace)::BrokenClient,char_const(&)[24],bool,unsigned_int_const*>
            ((kj *)&local_20,(char (*) [24])"Called null capability.",&local_21,&local_30);
  kj::Own<capnp::ClientHook>::Own<capnp::(anonymous_namespace)::BrokenClient,void>(in_RDI,&local_20)
  ;
  kj::Own<capnp::(anonymous_namespace)::BrokenClient>::~Own(&local_20);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)in_RDI;
  return OVar1;
}

Assistant:

kj::Own<ClientHook> newNullCap() {
  // A null capability, unlike other broken capabilities, is considered resolved.
  return kj::refcounted<BrokenClient>("Called null capability.", true,
                                      &ClientHook::NULL_CAPABILITY_BRAND);
}